

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O2

void __thiscall
Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Expected(Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  if (this->has_value_ == true) {
    std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector
              ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)this);
    return;
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Expected() {
		if (has_value_)
			value_.~T();
		else
			error_.~UnexpectedType();
	}